

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O2

Fl_Tree_Item * __thiscall Fl_Tree_Item::next_visible(Fl_Tree_Item *this,Fl_Tree_Prefs *prefs)

{
  char cVar1;
  int iVar2;
  
  cVar1 = prefs->_showroot;
  do {
    this = next(this);
    if (this == (Fl_Tree_Item *)0x0) {
      return (Fl_Tree_Item *)0x0;
    }
  } while (((this->_parent == (Fl_Tree_Item *)0x0) && (cVar1 == '\0')) ||
          (iVar2 = visible_r(this), iVar2 == 0));
  return this;
}

Assistant:

Fl_Tree_Item *Fl_Tree_Item::next_visible(Fl_Tree_Prefs &prefs) {
  Fl_Tree_Item *item = this;
  while ( 1 ) {
    item = item->next();
    if ( !item ) return 0;
    if ( item->is_root() && !prefs.showroot() ) continue;
    if ( item->visible_r() ) return(item);
  }
}